

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_file.c
# Opt level: O0

void test_write_format_zip_file(void)

{
  uint uVar1;
  int iVar2;
  tm *ptVar3;
  void *__ptr;
  void *_v1;
  char *file;
  int *piVar4;
  char *ld;
  void *extra;
  size_t sVar5;
  uchar *puVar6;
  void *_v2;
  int *piVar7;
  char *file_name;
  char file_data [8];
  uchar *extension_end;
  uchar *extension_start;
  uchar *eocd_record;
  uchar *eocd;
  uchar *local_header;
  uchar *central_header;
  uchar *p;
  uchar *buffend;
  uchar *buff;
  short file_gid;
  short file_uid;
  int zip_compression;
  int zip_version;
  int file_perm;
  unsigned_long crc;
  size_t buffsize;
  size_t used;
  tm *tm;
  time_t t;
  archive_entry *ae;
  archive *a;
  void *in_stack_fffffffffffffea8;
  archive_entry *paVar8;
  void *pvVar9;
  void *pvVar10;
  void *extra_00;
  archive_entry *in_stack_fffffffffffffeb0;
  uchar *puVar11;
  char *pcVar12;
  archive *in_stack_fffffffffffffeb8;
  longlong lVar13;
  undefined4 in_stack_fffffffffffffec0;
  wchar_t in_stack_fffffffffffffec4;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  undefined1 uVar14;
  void *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffef0;
  void *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  void *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  wchar_t wVar15;
  char *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  void *in_stack_ffffffffffffff40;
  char *local_a0;
  undefined8 local_98;
  int *local_60;
  long local_28;
  time_t local_18;
  archive_entry *local_10;
  archive_entry *local_8;
  
  wVar15 = (wchar_t)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  local_18 = 0x499602d2;
  ptVar3 = localtime(&local_18);
  local_98 = 0x3837363534333231;
  local_a0 = "file";
  __ptr = malloc(1000000);
  local_8 = (archive_entry *)archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (wchar_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
                   in_stack_fffffffffffffea8);
  archive_write_set_format_zip(in_stack_fffffffffffffeb8);
  paVar8 = local_8;
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,(longlong)in_stack_fffffffffffffeb8,
                      (char *)in_stack_fffffffffffffeb0,(longlong)local_8,(char *)0x21b891,
                      in_stack_fffffffffffffee0);
  archive_write_set_options((archive *)in_stack_fffffffffffffeb0,(char *)paVar8);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,(longlong)in_stack_fffffffffffffeb8,
                      (char *)in_stack_fffffffffffffeb0,(longlong)local_8,(char *)0x21b8d7,
                      in_stack_fffffffffffffee0);
  archive_write_open_memory
            ((archive *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
             (void *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (size_t)in_stack_fffffffffffffeb8,(size_t *)in_stack_fffffffffffffeb0);
  paVar8 = local_8;
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,(longlong)in_stack_fffffffffffffeb8,
                      (char *)in_stack_fffffffffffffeb0,(longlong)local_8,(char *)0x21b92e,
                      in_stack_fffffffffffffee0);
  local_10 = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (wchar_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,paVar8);
  archive_entry_copy_pathname(in_stack_fffffffffffffeb0,(char *)paVar8);
  archive_entry_set_mode(local_10,0x81a4);
  archive_entry_set_size(local_10,8);
  archive_entry_set_uid(local_10,10);
  archive_entry_set_gid(local_10,0x14);
  archive_entry_set_mtime(local_10,local_18,0);
  archive_write_header((archive *)in_stack_fffffffffffffeb0,paVar8);
  pvVar9 = (void *)0x0;
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,(longlong)in_stack_fffffffffffffeb8,
                      (char *)in_stack_fffffffffffffeb0,0,(char *)0x21ba2d,in_stack_fffffffffffffee0
                     );
  archive_entry_free((archive_entry *)0x21ba3a);
  archive_write_data((archive *)in_stack_fffffffffffffeb0,pvVar9,0x21ba54);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,(longlong)in_stack_fffffffffffffeb8,
                      (char *)in_stack_fffffffffffffeb0,0,(char *)0x21ba85,in_stack_fffffffffffffee0
                     );
  archive_write_close((archive *)0x21ba92);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,(longlong)in_stack_fffffffffffffeb8,
                      (char *)in_stack_fffffffffffffeb0,(longlong)local_8,(char *)0x21bac4,
                      in_stack_fffffffffffffee0);
  archive_write_free((archive *)0x21bad1);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,(longlong)in_stack_fffffffffffffeb8,
                      (char *)in_stack_fffffffffffffeb0,0,(char *)0x21baff,in_stack_fffffffffffffee0
                     );
  dumpfile((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
           in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
  failure("End-of-central-directory begins with PK\\005\\006 signature");
  puVar11 = "4";
  lVar13 = 0;
  assertion_equal_mem(in_stack_ffffffffffffff18,wVar15,in_stack_ffffffffffffff08,
                      in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                      CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
  failure("This must be disk 0");
  i2((uchar *)((long)__ptr + local_28 + -0x12));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21bbfa,
                      in_stack_fffffffffffffee0);
  failure("Central dir must start on disk 0");
  i2((uchar *)((long)__ptr + local_28 + -0x10));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21bc49,
                      in_stack_fffffffffffffee0);
  failure("All central dir entries are on this disk");
  uVar1 = i2((uchar *)((long)__ptr + local_28 + -0xe));
  _v1 = (void *)(ulong)uVar1;
  i2((uchar *)((long)__ptr + local_28 + -0xc));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21bcb3,
                      in_stack_fffffffffffffee0);
  pvVar9 = __ptr;
  uVar1 = i4(puVar11);
  file = (char *)((long)pvVar9 + (ulong)uVar1);
  i4(puVar11);
  failure("no zip comment");
  i2((uchar *)((long)__ptr + local_28 + -2));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21bd56,
                      in_stack_fffffffffffffee0);
  uVar1 = i4(puVar11);
  piVar4 = (int *)((long)__ptr + (ulong)uVar1);
  uVar1 = i4(puVar11);
  failure("Central file record at offset %d should begin with PK\\001\\002 signature",(ulong)uVar1);
  puVar11 = "4";
  lVar13 = 0;
  assertion_equal_mem(file,(wchar_t)((ulong)pvVar9 >> 0x20),_v1,in_stack_ffffffffffffff00,
                      in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                      CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
  i2((uchar *)(piVar4 + 1));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21be4c,
                      in_stack_fffffffffffffee0);
  i2((uchar *)((long)piVar4 + 6));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21be92,
                      in_stack_fffffffffffffee0);
  i2((uchar *)(piVar4 + 2));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21bed6,
                      in_stack_fffffffffffffee0);
  i2((uchar *)((long)piVar4 + 10));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21bf1c,
                      in_stack_fffffffffffffee0);
  i2((uchar *)(piVar4 + 3));
  iVar2 = ptVar3->tm_hour * 0x800 + ptVar3->tm_min * 0x20;
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21bfad,
                      in_stack_fffffffffffffee0);
  i2((uchar *)((long)piVar4 + 0xe));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c01d,
                      in_stack_fffffffffffffee0);
  bitcrc32(0,&local_98,8);
  i4(puVar11);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c081,
                      in_stack_fffffffffffffee0);
  i4(puVar11);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c0c5,
                      in_stack_fffffffffffffee0);
  uVar1 = i2((uchar *)(piVar4 + 7));
  ld = (char *)(ulong)uVar1;
  strlen("file");
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c121,
                      in_stack_fffffffffffffee0);
  i2((uchar *)(piVar4 + 8));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c162,
                      in_stack_fffffffffffffee0);
  i2((uchar *)((long)piVar4 + 0x22));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c1a3,
                      in_stack_fffffffffffffee0);
  i2((uchar *)(piVar4 + 9));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c1e4,
                      in_stack_fffffffffffffee0);
  i4(puVar11);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c232,
                      in_stack_fffffffffffffee0);
  i4(puVar11);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c273,
                      in_stack_fffffffffffffee0);
  extra = (void *)((long)piVar4 + 0x2e);
  strlen("file");
  pcVar12 = "strlen(file_name)";
  lVar13 = 0;
  assertion_equal_mem(file,(wchar_t)((ulong)pvVar9 >> 0x20),_v1,in_stack_ffffffffffffff00,
                      in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                      CONCAT44(iVar2,in_stack_ffffffffffffff30),ld,extra);
  sVar5 = strlen("file");
  puVar6 = (uchar *)((long)piVar4 + sVar5 + 0x2e);
  uVar1 = i2((uchar *)((long)piVar4 + 0x1e));
  puVar11 = puVar6 + uVar1;
  i2(puVar6);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21c3a9,
                      in_stack_fffffffffffffee0);
  i2(puVar6 + 2);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21c3ed,
                      in_stack_fffffffffffffee0);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21c42a,
                      in_stack_fffffffffffffee0);
  i4((uchar *)pcVar12);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21c470,
                      in_stack_fffffffffffffee0);
  uVar1 = i2(puVar6 + 2);
  puVar6 = puVar6 + (uVar1 + 4);
  i2(puVar6);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21c4db,
                      in_stack_fffffffffffffee0);
  i2(puVar6 + 2);
  pvVar10 = (void *)0x0;
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21c51f,
                      in_stack_fffffffffffffee0);
  uVar1 = i2(puVar6 + 2);
  for (local_60 = (int *)(puVar6 + (uVar1 + 4)); local_60 < puVar11;
      local_60 = (int *)((long)local_60 + (ulong)(uVar1 + 4))) {
    uVar1 = i2((uchar *)local_60);
    failure("Unexpected extension 0x%04X",(ulong)uVar1);
    assertion_assert((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (wchar_t)((ulong)lVar13 >> 0x20),(wchar_t)lVar13,pcVar12,pvVar10);
    uVar1 = i2((uchar *)((long)local_60 + 2));
  }
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (wchar_t)((ulong)lVar13 >> 0x20),(wchar_t)lVar13,pcVar12,pvVar10);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (wchar_t)((ulong)lVar13 >> 0x20),(wchar_t)lVar13,pcVar12,pvVar10);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (wchar_t)((ulong)lVar13 >> 0x20),(wchar_t)lVar13,pcVar12,pvVar10);
  puVar11 = "4";
  lVar13 = 0;
  assertion_equal_mem(file,(wchar_t)((ulong)pvVar9 >> 0x20),_v1,in_stack_ffffffffffffff00,
                      in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                      CONCAT44(iVar2,in_stack_ffffffffffffff30),ld,extra);
  i2((uchar *)((long)__ptr + 4));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c710,
                      in_stack_fffffffffffffee0);
  i2((uchar *)((long)__ptr + 6));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c754,
                      in_stack_fffffffffffffee0);
  i2((uchar *)((long)__ptr + 8));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c79a,
                      in_stack_fffffffffffffee0);
  i2((uchar *)((long)__ptr + 10));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c81f,
                      in_stack_fffffffffffffee0);
  i2((uchar *)((long)__ptr + 0xc));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c88f,
                      in_stack_fffffffffffffee0);
  i4(puVar11);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c8d0,
                      in_stack_fffffffffffffee0);
  uVar1 = i2((uchar *)((long)__ptr + 0x1a));
  pvVar10 = (void *)(ulong)uVar1;
  strlen("file");
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c926,pvVar10);
  i2((uchar *)((long)__ptr + 0x1c));
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,(char *)puVar11,0,(char *)0x21c96a,pvVar10);
  strlen("file");
  pcVar12 = "strlen(file_name)";
  lVar13 = 0;
  assertion_equal_mem(file,(wchar_t)((ulong)pvVar9 >> 0x20),_v1,in_stack_ffffffffffffff00,
                      in_stack_fffffffffffffef8,local_a0,CONCAT44(iVar2,in_stack_ffffffffffffff30),
                      ld,extra);
  _v2 = (void *)((long)__ptr + 0x1e);
  sVar5 = strlen("file");
  puVar6 = (uchar *)((long)_v2 + sVar5);
  puVar11 = puVar6;
  uVar1 = i2((uchar *)((long)__ptr + 0x1c));
  piVar7 = (int *)(puVar11 + uVar1);
  i2(puVar6);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21ca88,pvVar10);
  i2(puVar6 + 2);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21cacc,pvVar10);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21cb09,pvVar10);
  i4((uchar *)pcVar12);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21cb4f,pvVar10);
  uVar1 = i2(puVar6 + 2);
  puVar6 = puVar6 + (uVar1 + 4);
  i2(puVar6);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21cbba,pvVar10);
  i2(puVar6 + 2);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21cbfe,pvVar10);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21cc3b,pvVar10);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21cc78,pvVar10);
  i4((uchar *)pcVar12);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21ccbf,pvVar10);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21ccfc,pvVar10);
  i4((uchar *)pcVar12);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21cd43,pvVar10);
  uVar1 = i2(puVar6 + 2);
  puVar6 = puVar6 + (uVar1 + 4);
  i2(puVar6);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21cdae,pvVar10);
  i2(puVar6 + 2);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21cdf2,pvVar10);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21ce2f,pvVar10);
  i2(puVar6 + 5);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21ce76,pvVar10);
  i2(puVar6 + 7);
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21ceb7,pvVar10);
  i4((uchar *)pcVar12);
  extra_00 = (void *)0x0;
  assertion_equal_int((char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      in_stack_fffffffffffffec4,lVar13,pcVar12,0,(char *)0x21cf05,pvVar10);
  uVar1 = i2(puVar6 + 2);
  for (local_60 = (int *)(puVar6 + (uVar1 + 4)); wVar15 = (wchar_t)((ulong)pvVar9 >> 0x20),
      local_60 < piVar7; local_60 = (int *)((long)local_60 + (ulong)(uVar1 + 4))) {
    uVar1 = i2((uchar *)local_60);
    failure("Unexpected extension 0x%04X",(ulong)uVar1);
    assertion_assert((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (wchar_t)((ulong)lVar13 >> 0x20),(wchar_t)lVar13,pcVar12,extra_00);
    uVar1 = i2((uchar *)((long)local_60 + 2));
  }
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (wchar_t)((ulong)lVar13 >> 0x20),(wchar_t)lVar13,pcVar12,extra_00);
  while( true ) {
    uVar14 = false;
    if (local_60 < piVar4) {
      uVar14 = *local_60 != 0x8074b50;
    }
    if ((bool)uVar14 == false) break;
    local_60 = (int *)((long)local_60 + 1);
  }
  puVar6 = "4";
  lVar13 = 0;
  assertion_equal_mem(file,wVar15,_v1,(char *)puVar11,_v2,local_a0,
                      CONCAT44(iVar2,in_stack_ffffffffffffff30),ld,extra);
  i4(puVar6);
  assertion_equal_int((char *)CONCAT17(uVar14,in_stack_fffffffffffffec8),in_stack_fffffffffffffec4,
                      lVar13,(char *)puVar6,0,(char *)0x21d0cb,pvVar10);
  i4(puVar6);
  pvVar9 = (void *)0x0;
  assertion_equal_int((char *)CONCAT17(uVar14,in_stack_fffffffffffffec8),in_stack_fffffffffffffec4,
                      lVar13,(char *)puVar6,0,(char *)0x21d10f,pvVar10);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (wchar_t)((ulong)lVar13 >> 0x20),(wchar_t)lVar13,(char *)puVar6,pvVar9);
  free(__ptr);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_file)
{
	struct archive *a;
	struct archive_entry *ae;
	time_t t = 1234567890;
	struct tm *tm = localtime(&t);
	size_t used, buffsize = 1000000;
	unsigned long crc;
	int file_perm = 00644;
	int zip_version = 20;
	int zip_compression = 8;
	short file_uid = 10, file_gid = 20;
	unsigned char *buff, *buffend, *p;
	unsigned char *central_header, *local_header, *eocd, *eocd_record;
	unsigned char *extension_start, *extension_end;
	char file_data[] = {'1', '2', '3', '4', '5', '6', '7', '8'};
	char *file_name = "file";

#ifndef HAVE_ZLIB_H
	zip_version = 10;
	zip_compression = 0;
#endif

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:experimental"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, file_name);
	archive_entry_set_mode(ae, AE_IFREG | file_perm);
	archive_entry_set_size(ae, sizeof(file_data));
	archive_entry_set_uid(ae, file_uid);
	archive_entry_set_gid(ae, file_gid);
	archive_entry_set_mtime(ae, t, 0);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, file_data, sizeof(file_data)));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	buffend = buff + used;
	dumpfile("constructed.zip", buff, used);

	/* Verify "End of Central Directory" record. */
	/* Get address of end-of-central-directory record. */
	eocd_record = p = buffend - 22; /* Assumes there is no zip comment field. */
	failure("End-of-central-directory begins with PK\\005\\006 signature");
	assertEqualMem(p, "PK\005\006", 4);
	failure("This must be disk 0");
	assertEqualInt(i2(p + 4), 0);
	failure("Central dir must start on disk 0");
	assertEqualInt(i2(p + 6), 0);
	failure("All central dir entries are on this disk");
	assertEqualInt(i2(p + 8), i2(p + 10));
	eocd = buff + i4(p + 12) + i4(p + 16);
	failure("no zip comment");
	assertEqualInt(i2(p + 20), 0);

	/* Get address of first entry in central directory. */
	central_header = p = buff + i4(buffend - 6);
	failure("Central file record at offset %d should begin with"
	    " PK\\001\\002 signature",
	    i4(buffend - 10));

	/* Verify file entry in central directory. */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2(p + 4), 3 * 256 + zip_version); /* Version made by */
	assertEqualInt(i2(p + 6), zip_version); /* Version needed to extract */
	assertEqualInt(i2(p + 8), 8); /* Flags */
	assertEqualInt(i2(p + 10), zip_compression); /* Compression method */
	assertEqualInt(i2(p + 12), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(p + 14), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	crc = bitcrc32(0, file_data, sizeof(file_data));
	assertEqualInt(i4(p + 16), crc); /* CRC-32 */
	/* assertEqualInt(i4(p + 20), sizeof(file_data)); */ /* Compressed size */
	assertEqualInt(i4(p + 24), sizeof(file_data)); /* Uncompressed size */
	assertEqualInt(i2(p + 28), strlen(file_name)); /* Pathname length */
	/* assertEqualInt(i2(p + 30), 28); */ /* Extra field length: See below */
	assertEqualInt(i2(p + 32), 0); /* File comment length */
	assertEqualInt(i2(p + 34), 0); /* Disk number start */
	assertEqualInt(i2(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4(p + 38) >> 16 & 01777, file_perm); /* External file attrs */
	assertEqualInt(i4(p + 42), 0); /* Offset of local header */
	assertEqualMem(p + 46, file_name, strlen(file_name)); /* Pathname */
	p = extension_start = central_header + 46 + strlen(file_name);
	extension_end = extension_start + i2(central_header + 30);

	assertEqualInt(i2(p), 0x5455);  /* 'UT' extension header */
	assertEqualInt(i2(p + 2), 5); /* 'UT' size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4(p + 5), t); /* 'UT' mtime */
	p += 4 + i2(p + 2);

	assertEqualInt(i2(p), 0x7875);  /* 'ux' extension header */
	assertEqualInt(i2(p + 2), 11); /* 'ux' size */
	/* TODO: verify 'ux' contents */
	p += 4 + i2(p + 2);

	/* Just in case: Report any extra extensions. */
	while (p < extension_end) {
		failure("Unexpected extension 0x%04X", i2(p));
		assert(0);
		p += 4 + i2(p + 2);
	}

	/* Should have run exactly to end of extra data. */
	assert(p == extension_end);

	assert(p == eocd);

	/* Regular EOCD immediately follows central directory. */
	assert(p == eocd_record);

	/* Verify local header of file entry. */
	p = local_header = buff;
	assertEqualMem(p, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2(p + 4), zip_version); /* Version needed to extract */
	assertEqualInt(i2(p + 6), 8); /* Flags */
	assertEqualInt(i2(p + 8), zip_compression); /* Compression method */
	assertEqualInt(i2(p + 10), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(p + 12), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	assertEqualInt(i4(p + 14), 0); /* CRC-32 */
	/* assertEqualInt(i4(p + 18), sizeof(file_data)); */ /* Compressed size */
	/* assertEqualInt(i4(p + 22), sizeof(file_data)); */ /* Uncompressed size not stored because we're using length-at-end. */
	assertEqualInt(i2(p + 26), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2(p + 28), 37); /* Extra field length */
	assertEqualMem(p + 30, file_name, strlen(file_name)); /* Pathname */
	p = extension_start = local_header + 30 + strlen(file_name);
	extension_end = extension_start + i2(local_header + 28);

	assertEqualInt(i2(p), 0x5455);  /* 'UT' extension header */
	assertEqualInt(i2(p + 2), 5); /* size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4(p + 5), t); /* 'UT' mtime */
	p += 4 + i2(p + 2);

	assertEqualInt(i2(p), 0x7875);  /* 'ux' extension header */
	assertEqualInt(i2(p + 2), 11); /* size */
	assertEqualInt(p[4], 1); /* 'ux' version */
	assertEqualInt(p[5], 4); /* 'ux' uid size */
	assertEqualInt(i4(p + 6), file_uid); /* 'Ux' UID */
	assertEqualInt(p[10], 4); /* 'ux' gid size */
	assertEqualInt(i4(p + 11), file_gid); /* 'Ux' GID */
	p += 4 + i2(p + 2);

	assertEqualInt(i2(p), 0x6c65); /* 'el' experimental extension block */
	assertEqualInt(i2(p + 2), 9); /* size */
	assertEqualInt(p[4], 7); /* bitmap of fields in this block */
	assertEqualInt(i2(p + 5) >> 8, 3); /* System & version made by */
	assertEqualInt(i2(p + 7), 0); /* internal file attributes */
	assertEqualInt(i4(p + 9) >> 16 & 01777, file_perm); /* external file attributes */
	p += 4 + i2(p + 2);

	/* Just in case: Report any extra extensions. */
	while (p < extension_end) {
		failure("Unexpected extension 0x%04X", i2(p));
		assert(0);
		p += 4 + i2(p + 2);
	}

	/* Should have run exactly to end of extra data. */
	assert(p == extension_end);

	/* Data descriptor should follow compressed data. */
	while (p < central_header && memcmp(p, "PK\007\010", 4) != 0)
		++p;
	assertEqualMem(p, "PK\007\010", 4);
	assertEqualInt(i4(p + 4), crc); /* CRC-32 */
	/* assertEqualInt(i4(p + 8), ???); */ /* compressed size */
	assertEqualInt(i4(p + 12), sizeof(file_data)); /* uncompressed size */

	/* Central directory should immediately follow the only entry. */
	assert(p + 16 == central_header);

	free(buff);
}